

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.h
# Opt level: O0

errc psql::serialization_traits<psql::row_description,_(psql::serialization_tag)0>::deserialize_
               (row_description *output,deserialization_context *ctx)

{
  errc eVar1;
  reference output_00;
  int local_2c;
  int i;
  errc err;
  int16_t num_fields;
  deserialization_context *ctx_local;
  row_description *output_local;
  
  i._2_2_ = 0;
  _err = ctx;
  ctx_local = (deserialization_context *)output;
  output_local._4_4_ = deserialize<short>((short *)((long)&i + 2),ctx);
  if (output_local._4_4_ == ok) {
    std::vector<psql::single_row_description,_std::allocator<psql::single_row_description>_>::resize
              ((vector<psql::single_row_description,_std::allocator<psql::single_row_description>_>
                *)ctx_local,(long)i._2_2_);
    for (local_2c = 0; local_2c < i._2_2_; local_2c = local_2c + 1) {
      output_00 = std::
                  vector<psql::single_row_description,_std::allocator<psql::single_row_description>_>
                  ::operator[]((vector<psql::single_row_description,_std::allocator<psql::single_row_description>_>
                                *)ctx_local,(long)local_2c);
      eVar1 = deserialize<psql::single_row_description>(output_00,_err);
      if (eVar1 != ok) {
        return eVar1;
      }
    }
    output_local._4_4_ = ok;
  }
  return output_local._4_4_;
}

Assistant:

static inline errc deserialize_(row_description& output, deserialization_context& ctx)
	{
		std::int16_t num_fields = 0;
		auto err = deserialize(num_fields, ctx);
		if (err != errc::ok) return err;

		output.rows.resize(num_fields); // noexcept specifiers are not correct but ok for a prototype
		for (int i = 0; i < num_fields; ++i)
		{
			err = deserialize(output.rows[i], ctx);
			if (err != errc::ok) return err;
		}

		return errc::ok;
	}